

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_world_ego(parser *p)

{
  void *pvVar1;
  char *pcVar2;
  char *name;
  level_map_conflict *map;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    if (*(int *)(*(long *)((long)pvVar1 + 0x18) + (long)(*(int *)((long)pvVar1 + 0x10) + -1) * 0x50
                + 4) != 0) {
      __assert_fail("map->levels[map->num_levels - 1].depth == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/init.c"
                    ,0x46d,"enum parser_error parse_world_ego(struct parser *)");
    }
    if (*(int *)(*(long *)((long)pvVar1 + 0x20) + (long)(*(int *)((long)pvVar1 + 0x14) + -1) * 0x28)
        != *(int *)((long)pvVar1 + 0x10) + -1) {
      __assert_fail("map->towns[map->num_towns - 1].index == map->num_levels - 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/init.c"
                    ,0x46e,"enum parser_error parse_world_ego(struct parser *)");
    }
    pcVar2 = parser_getstr(p,"name");
    pcVar2 = string_make(pcVar2);
    *(char **)(*(long *)((long)pvVar1 + 0x20) + (long)(*(int *)((long)pvVar1 + 0x14) + -1) * 0x28 +
              0x10) = pcVar2;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_world_ego(struct parser *p) {
	struct level_map *map = parser_priv(p);
	const char *name;

	if (!map)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	assert(map->levels[map->num_levels - 1].depth == 0);
	assert(map->towns[map->num_towns - 1].index == map->num_levels - 1);
	name = parser_getstr(p, "name");
	map->towns[map->num_towns - 1].ego = string_make(name);
	return PARSE_ERROR_NONE;
}